

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConfigureFileCommand.cxx
# Opt level: O0

bool __thiscall
cmConfigureFileCommand::InitialPass
          (cmConfigureFileCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  bool bVar1;
  int iVar2;
  size_type sVar3;
  const_reference pvVar4;
  string *psVar5;
  ostream *poVar6;
  ulong uVar7;
  allocator<char> local_369;
  string local_368;
  allocator<char> local_341;
  undefined1 local_340 [8];
  string msg;
  string local_318;
  uint local_2f4;
  string local_2f0 [4];
  uint i;
  string unknown_args;
  undefined1 local_2c8 [8];
  string errorMessage;
  undefined1 local_288 [8];
  string e_1;
  string local_248;
  const_reference local_228;
  string *outFile;
  ostringstream local_200 [8];
  ostringstream e;
  string local_88;
  const_reference local_68;
  string *inFile;
  allocator<char> local_49;
  string local_48;
  cmExecutionStatus *local_28;
  cmExecutionStatus *param_2_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmConfigureFileCommand *this_local;
  
  local_28 = param_2;
  param_2_local = (cmExecutionStatus *)args;
  args_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this;
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  if (sVar3 < 2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"called with incorrect number of arguments, expected 2",&local_49
              );
    cmCommand::SetError(&this->super_cmCommand,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator(&local_49);
    this_local._7_1_ = 0;
  }
  else {
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)param_2_local,0);
    local_68 = pvVar4;
    psVar5 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_((this->super_cmCommand).Makefile);
    cmsys::SystemTools::CollapseFullPath(&local_88,pvVar4,psVar5);
    std::__cxx11::string::operator=((string *)&this->InputFile,(string *)&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    bVar1 = cmsys::SystemTools::FileIsDirectory(&this->InputFile);
    if (bVar1) {
      std::__cxx11::ostringstream::ostringstream(local_200);
      poVar6 = std::operator<<((ostream *)local_200,"input location\n");
      poVar6 = std::operator<<(poVar6,"  ");
      poVar6 = std::operator<<(poVar6,(string *)&this->InputFile);
      poVar6 = std::operator<<(poVar6,"\n");
      std::operator<<(poVar6,"is a directory but a file was expected.");
      std::__cxx11::ostringstream::str();
      cmCommand::SetError(&this->super_cmCommand,(string *)&outFile);
      std::__cxx11::string::~string((string *)&outFile);
      this_local._7_1_ = 0;
      std::__cxx11::ostringstream::~ostringstream(local_200);
    }
    else {
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)param_2_local,1);
      local_228 = pvVar4;
      psVar5 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_((this->super_cmCommand).Makefile);
      cmsys::SystemTools::CollapseFullPath(&local_248,pvVar4,psVar5);
      std::__cxx11::string::operator=((string *)&this->OutputFile,(string *)&local_248);
      std::__cxx11::string::~string((string *)&local_248);
      bVar1 = cmsys::SystemTools::FileIsDirectory(&this->OutputFile);
      if (bVar1) {
        std::__cxx11::string::operator+=((string *)&this->OutputFile,"/");
        cmsys::SystemTools::GetFilenameName((string *)(e_1.field_2._M_local_buf + 8),local_68);
        std::__cxx11::string::operator+=
                  ((string *)&this->OutputFile,(string *)(e_1.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)(e_1.field_2._M_local_buf + 8));
      }
      bVar1 = cmMakefile::CanIWriteThisFile((this->super_cmCommand).Makefile,&this->OutputFile);
      if (bVar1) {
        std::__cxx11::string::string((string *)local_2c8);
        bVar1 = cmNewLineStyle::ReadFromArguments
                          (&this->NewLineStyle,
                           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)param_2_local,(string *)local_2c8);
        if (bVar1) {
          this->CopyOnly = false;
          this->EscapeQuotes = false;
          std::__cxx11::string::string(local_2f0);
          this->AtOnly = false;
          for (local_2f4 = 2; uVar7 = (ulong)local_2f4,
              sVar3 = std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)param_2_local), uVar7 < sVar3; local_2f4 = local_2f4 + 1) {
            pvVar4 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)param_2_local,(ulong)local_2f4);
            bVar1 = std::operator==(pvVar4,"COPYONLY");
            if (bVar1) {
              this->CopyOnly = true;
              bVar1 = cmNewLineStyle::IsValid(&this->NewLineStyle);
              if (bVar1) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_318,
                           "COPYONLY could not be used in combination with NEWLINE_STYLE",
                           (allocator<char> *)(msg.field_2._M_local_buf + 0xf));
                cmCommand::SetError(&this->super_cmCommand,&local_318);
                std::__cxx11::string::~string((string *)&local_318);
                std::allocator<char>::~allocator
                          ((allocator<char> *)(msg.field_2._M_local_buf + 0xf));
                this_local._7_1_ = 0;
                goto LAB_0032dcad;
              }
            }
            else {
              pvVar4 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)param_2_local,(ulong)local_2f4);
              bVar1 = std::operator==(pvVar4,"ESCAPE_QUOTES");
              if (bVar1) {
                this->EscapeQuotes = true;
              }
              else {
                pvVar4 = std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       *)param_2_local,(ulong)local_2f4);
                bVar1 = std::operator==(pvVar4,"@ONLY");
                if (bVar1) {
                  this->AtOnly = true;
                }
                else {
                  pvVar4 = std::
                           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         *)param_2_local,(ulong)local_2f4);
                  bVar1 = std::operator==(pvVar4,"IMMEDIATE");
                  if (!bVar1) {
                    pvVar4 = std::
                             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           *)param_2_local,(ulong)local_2f4);
                    bVar1 = std::operator==(pvVar4,"NEWLINE_STYLE");
                    if (!bVar1) {
                      pvVar4 = std::
                               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             *)param_2_local,(ulong)local_2f4);
                      bVar1 = std::operator==(pvVar4,"LF");
                      if (!bVar1) {
                        pvVar4 = std::
                                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               *)param_2_local,(ulong)local_2f4);
                        bVar1 = std::operator==(pvVar4,"UNIX");
                        if (!bVar1) {
                          pvVar4 = std::
                                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 *)param_2_local,(ulong)local_2f4);
                          bVar1 = std::operator==(pvVar4,"CRLF");
                          if (!bVar1) {
                            pvVar4 = std::
                                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ::operator[]((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)param_2_local,(ulong)local_2f4);
                            bVar1 = std::operator==(pvVar4,"WIN32");
                            if (!bVar1) {
                              pvVar4 = std::
                                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ::operator[]((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)param_2_local,(ulong)local_2f4);
                              bVar1 = std::operator==(pvVar4,"DOS");
                              if (!bVar1) {
                                std::__cxx11::string::operator+=(local_2f0," ");
                                pvVar4 = std::
                                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ::operator[]((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)param_2_local,(ulong)local_2f4);
                                std::__cxx11::string::operator+=(local_2f0,(string *)pvVar4);
                                std::__cxx11::string::operator+=(local_2f0,"\n");
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
          uVar7 = std::__cxx11::string::empty();
          if ((uVar7 & 1) == 0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)local_340,"configure_file called with unknown argument(s):\n",
                       &local_341);
            std::allocator<char>::~allocator(&local_341);
            std::__cxx11::string::operator+=((string *)local_340,local_2f0);
            cmMakefile::IssueMessage
                      ((this->super_cmCommand).Makefile,AUTHOR_WARNING,(string *)local_340);
            std::__cxx11::string::~string((string *)local_340);
          }
          iVar2 = ConfigureFile(this);
          if (iVar2 == 0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_368,"Problem configuring file",&local_369);
            cmCommand::SetError(&this->super_cmCommand,&local_368);
            std::__cxx11::string::~string((string *)&local_368);
            std::allocator<char>::~allocator(&local_369);
            this_local._7_1_ = 0;
          }
          else {
            this_local._7_1_ = 1;
          }
LAB_0032dcad:
          unknown_args.field_2._12_4_ = 1;
          std::__cxx11::string::~string(local_2f0);
        }
        else {
          cmCommand::SetError(&this->super_cmCommand,(string *)local_2c8);
          this_local._7_1_ = 0;
          unknown_args.field_2._12_4_ = 1;
        }
        std::__cxx11::string::~string((string *)local_2c8);
      }
      else {
        __return_storage_ptr__ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&errorMessage.field_2 + 8);
        std::operator+(__return_storage_ptr__,"attempted to configure a file: ",&this->OutputFile);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_288,__return_storage_ptr__," into a source directory.");
        std::__cxx11::string::~string((string *)(errorMessage.field_2._M_local_buf + 8));
        cmCommand::SetError(&this->super_cmCommand,(string *)local_288);
        cmSystemTools::SetFatalErrorOccured();
        this_local._7_1_ = 0;
        std::__cxx11::string::~string((string *)local_288);
      }
    }
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmConfigureFileCommand::InitialPass(std::vector<std::string> const& args,
                                         cmExecutionStatus&)
{
  if (args.size() < 2) {
    this->SetError("called with incorrect number of arguments, expected 2");
    return false;
  }

  std::string const& inFile = args[0];
  this->InputFile = cmSystemTools::CollapseFullPath(
    inFile, this->Makefile->GetCurrentSourceDirectory());

  // If the input location is a directory, error out.
  if (cmSystemTools::FileIsDirectory(this->InputFile)) {
    std::ostringstream e;
    /* clang-format off */
    e << "input location\n"
      << "  " << this->InputFile << "\n"
      << "is a directory but a file was expected.";
    /* clang-format on */
    this->SetError(e.str());
    return false;
  }

  std::string const& outFile = args[1];
  this->OutputFile = cmSystemTools::CollapseFullPath(
    outFile, this->Makefile->GetCurrentBinaryDirectory());

  // If the output location is already a directory put the file in it.
  if (cmSystemTools::FileIsDirectory(this->OutputFile)) {
    this->OutputFile += "/";
    this->OutputFile += cmSystemTools::GetFilenameName(inFile);
  }

  if (!this->Makefile->CanIWriteThisFile(this->OutputFile)) {
    std::string e = "attempted to configure a file: " + this->OutputFile +
      " into a source directory.";
    this->SetError(e);
    cmSystemTools::SetFatalErrorOccured();
    return false;
  }
  std::string errorMessage;
  if (!this->NewLineStyle.ReadFromArguments(args, errorMessage)) {
    this->SetError(errorMessage);
    return false;
  }
  this->CopyOnly = false;
  this->EscapeQuotes = false;

  std::string unknown_args;
  this->AtOnly = false;
  for (unsigned int i = 2; i < args.size(); ++i) {
    if (args[i] == "COPYONLY") {
      this->CopyOnly = true;
      if (this->NewLineStyle.IsValid()) {
        this->SetError("COPYONLY could not be used in combination "
                       "with NEWLINE_STYLE");
        return false;
      }
    } else if (args[i] == "ESCAPE_QUOTES") {
      this->EscapeQuotes = true;
    } else if (args[i] == "@ONLY") {
      this->AtOnly = true;
    } else if (args[i] == "IMMEDIATE") {
      /* Ignore legacy option.  */
    } else if (args[i] == "NEWLINE_STYLE" || args[i] == "LF" ||
               args[i] == "UNIX" || args[i] == "CRLF" || args[i] == "WIN32" ||
               args[i] == "DOS") {
      /* Options handled by NewLineStyle member above.  */
    } else {
      unknown_args += " ";
      unknown_args += args[i];
      unknown_args += "\n";
    }
  }
  if (!unknown_args.empty()) {
    std::string msg = "configure_file called with unknown argument(s):\n";
    msg += unknown_args;
    this->Makefile->IssueMessage(MessageType::AUTHOR_WARNING, msg);
  }

  if (!this->ConfigureFile()) {
    this->SetError("Problem configuring file");
    return false;
  }

  return true;
}